

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall Fl_Tree::next_selected_item(Fl_Tree *this,Fl_Tree_Item *item,int dir)

{
  int iVar1;
  
  if (dir == 0xff52) {
    if (item != (Fl_Tree_Item *)0x0) goto LAB_001d9af5;
    item = this->_root;
    if (item != (Fl_Tree_Item *)0x0) {
      for (; iVar1 = (item->_children)._total, iVar1 != 0;
          item = (item->_children)._items[(long)iVar1 + -1]) {
      }
      do {
        if (item->_selected != '\0') {
          return item;
        }
LAB_001d9af5:
        item = Fl_Tree_Item::prev(item);
      } while (item != (Fl_Tree_Item *)0x0);
    }
  }
  else if (dir == 0xff54) {
    if (item != (Fl_Tree_Item *)0x0) goto LAB_001d9ae5;
    for (item = this->_root; item != (Fl_Tree_Item *)0x0; item = Fl_Tree_Item::next(item)) {
      if (item->_selected != '\0') {
        return item;
      }
LAB_001d9ae5:
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree::next_selected_item(Fl_Tree_Item *item, int dir) {
  switch (dir) {
    case FL_Down:
      if ( ! item ) {
	if ( ! (item = first()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->next()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
    case FL_Up:
      if ( ! item ) {
	if ( ! (item = last()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->prev()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
  }
  return(0);
}